

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEquiv.c
# Opt level: O1

void Gia_ManOrigIdsRemap(Gia_Man_t *p,Gia_Man_t *pNew)

{
  int iVar1;
  Vec_Int_t *pVVar2;
  int *piVar3;
  ulong uVar4;
  uint *puVar5;
  long lVar6;
  ulong uVar7;
  uint uVar8;
  
  if (p->vIdsOrig != (Vec_Int_t *)0x0) {
    Gia_ManOrigIdsStart(pNew);
    pVVar2 = pNew->vIdsOrig;
    if (pVVar2->nSize < 1) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
    }
    piVar3 = pVVar2->pArray;
    *piVar3 = 0;
    if (1 < p->nObjs) {
      puVar5 = &p->pObjs[1].Value;
      lVar6 = 1;
      do {
        uVar8 = *puVar5;
        if (uVar8 != 0xffffffff) {
          if ((int)uVar8 < 0) {
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                          ,0x12f,"int Abc_Lit2Var(int)");
          }
          if (1 < uVar8) {
            if (p->vIdsOrig->nSize <= lVar6) goto LAB_001fc36b;
            iVar1 = p->vIdsOrig->pArray[lVar6];
            if (iVar1 != -1) {
              uVar8 = uVar8 >> 1;
              if (pVVar2->nSize <= (int)uVar8) goto LAB_001fc36b;
              if (piVar3[uVar8] == -1) {
                piVar3[uVar8] = iVar1;
              }
            }
          }
        }
        lVar6 = lVar6 + 1;
        puVar5 = puVar5 + 3;
      } while (lVar6 < p->nObjs);
    }
    if ((0 < pNew->nObjs) && (pNew->pObjs != (Gia_Obj_t *)0x0)) {
      uVar7 = 0;
      uVar4 = (ulong)(uint)pVVar2->nSize;
      if (pVVar2->nSize < 1) {
        uVar4 = uVar7;
      }
      do {
        if (uVar4 == uVar7) {
LAB_001fc36b:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        if (piVar3[uVar7] < 0) {
          __assert_fail("Vec_IntEntry(pNew->vIdsOrig, i) >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaEquiv.c"
                        ,0x43,"void Gia_ManOrigIdsRemap(Gia_Man_t *, Gia_Man_t *)");
        }
        uVar7 = uVar7 + 1;
      } while ((uint)pNew->nObjs != uVar7);
    }
  }
  return;
}

Assistant:

void Gia_ManOrigIdsRemap( Gia_Man_t * p, Gia_Man_t * pNew )
{
    Gia_Obj_t * pObj; int i;
    if ( p->vIdsOrig == NULL )
        return;
    Gia_ManOrigIdsStart( pNew );
    Vec_IntWriteEntry( pNew->vIdsOrig, 0, 0 );
    Gia_ManForEachObj1( p, pObj, i )
        if ( ~pObj->Value && Abc_Lit2Var(pObj->Value) && Vec_IntEntry(p->vIdsOrig, i) != -1 && Vec_IntEntry(pNew->vIdsOrig, Abc_Lit2Var(pObj->Value)) == -1 )
            Vec_IntWriteEntry( pNew->vIdsOrig, Abc_Lit2Var(pObj->Value), Vec_IntEntry(p->vIdsOrig, i) );
    Gia_ManForEachObj( pNew, pObj, i )
        assert( Vec_IntEntry(pNew->vIdsOrig, i) >= 0 );
}